

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::draw_vertical_line
          (Image *this,ssize_t x,ssize_t y1,ssize_t y2,ssize_t dash_length,uint64_t r,uint64_t g,
          uint64_t b,uint64_t a)

{
  out_of_range *e;
  undefined8 local_40;
  ssize_t y;
  uint64_t r_local;
  ssize_t dash_length_local;
  ssize_t y2_local;
  ssize_t y1_local;
  ssize_t x_local;
  Image *this_local;
  
  for (local_40 = y1; local_40 <= y2; local_40 = local_40 + 1) {
    if ((dash_length == 0) || ((local_40 / dash_length & 1U) == 0)) {
      write_pixel(this,x,local_40,r,g,b,a);
    }
  }
  return;
}

Assistant:

void Image::draw_vertical_line(ssize_t x, ssize_t y1, ssize_t y2,
    ssize_t dash_length, uint64_t r, uint64_t g, uint64_t b, uint64_t a) {

  for (ssize_t y = y1; y <= y2; y++) {
    if (dash_length && ((y / dash_length) & 1)) {
      continue;
    }
    try {
      this->write_pixel(x, y, r, g, b, a);
    } catch (const out_of_range& e) {
      break;
    }
  }
}